

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O2

int processPic(istream *in,path *output)

{
  ushort uVar1;
  ushort uVar2;
  uint32_t offset;
  pointer pPVar3;
  unsigned_long __val;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  PicHeader header;
  Image currentChunk;
  Image result;
  vector<MaskRect,_std::allocator<MaskRect>_> maskData;
  string local_68;
  _Vector_base<MaskRect,_std::allocator<MaskRect>_> local_48;
  
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operator>>(in,&header);
  Image::Image(&result,(Size)((ulong)header.height << 0x20 | (ulong)header.width),(Color)0x0);
  Image::Image(&currentChunk,(Size)0x0,(Color)0x0);
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar4 = 4;
  __val = 0;
  while( true ) {
    pPVar3 = header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xc) <= __val) break;
    offset = *(uint32_t *)
              ((long)&(header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl
                       .super__Vector_impl_data._M_start)->x + lVar4);
    std::__cxx11::to_string(&local_68,__val);
    std::operator+(&local_118,"chunk",&local_68);
    processChunk(&currentChunk,&maskData,offset,in,&local_118,header.isSwitch);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_68);
    uVar1 = *(ushort *)((long)pPVar3 + lVar4 + -4);
    uVar2 = *(ushort *)((long)pPVar3 + lVar4 + -2);
    std::vector<MaskRect,_std::allocator<MaskRect>_>::vector
              ((vector<MaskRect,_std::allocator<MaskRect>_> *)&local_48,&maskData);
    Image::drawOnto(&currentChunk,&result,(Point)((ulong)uVar2 << 0x20 | (ulong)uVar1),
                    (vector<MaskRect,_std::allocator<MaskRect>_> *)&local_48);
    std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base(&local_48);
    __val = __val + 1;
    lVar4 = lVar4 + 0xc;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"",(allocator<char> *)&local_68);
  Image::writePNG(&result,output,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::_Vector_base<MaskRect,_std::allocator<MaskRect>_>::~_Vector_base
            (&maskData.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&currentChunk.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<Color,_std::allocator<Color>_>::~_Vector_base
            (&result.colorData.super__Vector_base<Color,_std::allocator<Color>_>);
  std::_Vector_base<PicChunk,_std::allocator<PicChunk>_>::~_Vector_base
            (&header.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>);
  return 0;
}

Assistant:

int processPic(std::istream &in, const fs::path &output) {
	PicHeader header;
	in >> header;

	Image result({header.width, header.height}), currentChunk({0, 0});
	std::vector<MaskRect> maskData;

	for(size_t i = 0; i < header.chunks.size(); i++) {
		const auto &chunk = header.chunks[i];
		processChunk(currentChunk, maskData, chunk.offset, in, "chunk" + std::to_string(i), header.isSwitch);
		currentChunk.drawOnto(result, {chunk.x, chunk.y}, maskData);
	}

	result.writePNG(output);
	return 0;
}